

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_xonly_pubkey_tweak_add_check
              (secp256k1_context *ctx,uchar *tweaked_pubkey32,int tweaked_pk_parity,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_ge pk;
  uchar pk_expected32 [32];
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/main_impl.h"
            ,0x8c,"test condition failed: ctx != NULL");
    abort();
  }
  if (internal_pubkey == (secp256k1_xonly_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "internal_pubkey != NULL";
  }
  else if (tweaked_pubkey32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "tweaked_pubkey32 != NULL";
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      iVar1 = secp256k1_pubkey_load(ctx,&pk,(secp256k1_pubkey *)internal_pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_ec_pubkey_tweak_add_helper(&pk,tweak32);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_fe_normalize_var(&pk.x);
      secp256k1_fe_normalize_var(&pk.y);
      secp256k1_fe_get_b32(pk_expected32,&pk.x);
      iVar1 = secp256k1_memcmp_var(pk_expected32,tweaked_pubkey32,0x20);
      if (iVar1 != 0) {
        return 0;
      }
      iVar1 = secp256k1_fe_is_odd(&pk.y);
      return (uint)(iVar1 == tweaked_pk_parity);
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "tweak32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add_check(const secp256k1_context* ctx, const unsigned char *tweaked_pubkey32, int tweaked_pk_parity, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;
    unsigned char pk_expected32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweaked_pubkey32 != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&pk.x);
    secp256k1_fe_normalize_var(&pk.y);
    secp256k1_fe_get_b32(pk_expected32, &pk.x);

    return secp256k1_memcmp_var(&pk_expected32, tweaked_pubkey32, 32) == 0
            && secp256k1_fe_is_odd(&pk.y) == tweaked_pk_parity;
}